

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuHeapD.c
# Opt level: O0

void Fxu_HeapDoubleCheck(Fxu_HeapDouble *p)

{
  bool bVar1;
  Fxu_Double *local_18;
  Fxu_Double *pDiv;
  Fxu_HeapDouble *p_local;
  
  p->i = 1;
  while( true ) {
    bVar1 = false;
    if (p->i <= p->nItems) {
      local_18 = p->pTree[p->i];
      bVar1 = local_18 != (Fxu_Double *)0x0;
    }
    if (!bVar1) break;
    if (local_18->HNum != p->i) {
      __assert_fail("pDiv->HNum == p->i",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/fxu/fxuHeapD.c"
                    ,0x9d,"void Fxu_HeapDoubleCheck(Fxu_HeapDouble *)");
    }
    Fxu_HeapDoubleCheckOne(p,local_18);
    p->i = p->i + 1;
  }
  return;
}

Assistant:

void Fxu_HeapDoubleCheck( Fxu_HeapDouble * p )
{
	Fxu_Double * pDiv;
	Fxu_HeapDoubleForEachItem( p, pDiv )
	{
		assert( pDiv->HNum == p->i );
        Fxu_HeapDoubleCheckOne( p, pDiv );
	}
}